

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MemorySSA.cpp
# Opt level: O3

void dg::dda::joinDefinitions(Definitions *from,Definitions *to,bool escaping)

{
  DefinitionsMap<dg::dda::RWNode> *this;
  _Base_ptr p_Var1;
  RWNode *this_00;
  _Base_ptr p_Var2;
  _Base_ptr p_Var3;
  pointer pDVar4;
  bool bVar5;
  const_iterator cVar6;
  _Rb_tree_node_base *p_Var7;
  _Base_ptr p_Var8;
  DiscreteInterval<dg::Offset> *undefInterv;
  pointer pDVar9;
  _Rb_tree_node_base *p_Var10;
  const_iterator __begin2;
  _Hash_node_base *p_Var11;
  vector<dg::ADT::DiscreteInterval<dg::Offset>,_std::allocator<dg::ADT::DiscreteInterval<dg::Offset>_>_>
  uncovered;
  DefSite local_78;
  vector<dg::ADT::DiscreteInterval<dg::Offset>,_std::allocator<dg::ADT::DiscreteInterval<dg::Offset>_>_>
  local_60;
  Definitions *local_48;
  _Rb_tree_node_base *local_40;
  _Rb_tree_node_base *local_38;
  
  p_Var3 = Offset::UNKNOWN;
  p_Var11 = (from->definitions)._definitions._M_h._M_before_begin._M_nxt;
  local_48 = from;
  if (p_Var11 != (_Hash_node_base *)0x0) {
    this = &to->definitions;
    p_Var1 = (_Base_ptr)((long)&Offset::UNKNOWN[-1]._M_right + 7);
    do {
      if (escaping) {
        this_00 = (RWNode *)p_Var11[1]._M_nxt;
        bVar5 = RWNode::isDynAlloc(this_00);
        if (((bVar5) || (this_00->type == GLOBAL)) || (this_00->has_address_taken == true))
        goto LAB_00111479;
      }
      else {
LAB_00111479:
        local_60.
        super__Vector_base<dg::ADT::DiscreteInterval<dg::Offset>,_std::allocator<dg::ADT::DiscreteInterval<dg::Offset>_>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)p_Var11[1]._M_nxt;
        cVar6 = std::
                _Hashtable<dg::dda::RWNode_*,_std::pair<dg::dda::RWNode_*const,_dg::ADT::DisjunctiveIntervalMap<dg::dda::RWNode_*,_dg::Offset>_>,_std::allocator<std::pair<dg::dda::RWNode_*const,_dg::ADT::DisjunctiveIntervalMap<dg::dda::RWNode_*,_dg::Offset>_>_>,_std::__detail::_Select1st,_std::equal_to<dg::dda::RWNode_*>,_std::hash<dg::dda::RWNode_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                ::find((_Hashtable<dg::dda::RWNode_*,_std::pair<dg::dda::RWNode_*const,_dg::ADT::DisjunctiveIntervalMap<dg::dda::RWNode_*,_dg::Offset>_>,_std::allocator<std::pair<dg::dda::RWNode_*const,_dg::ADT::DisjunctiveIntervalMap<dg::dda::RWNode_*,_dg::Offset>_>_>,_std::__detail::_Select1st,_std::equal_to<dg::dda::RWNode_*>,_std::hash<dg::dda::RWNode_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                        *)this,(key_type *)&local_60);
        if (cVar6.
            super__Node_iterator_base<std::pair<dg::dda::RWNode_*const,_dg::ADT::DisjunctiveIntervalMap<dg::dda::RWNode_*,_dg::Offset>_>,_false>
            ._M_cur == (__node_type *)0x0) {
          DefinitionsMap<dg::dda::RWNode>::add
                    (this,(RWNode *)p_Var11[1]._M_nxt,(OffsetsT *)(p_Var11 + 2));
        }
        else {
          p_Var7 = (_Rb_tree_node_base *)p_Var11[5]._M_nxt;
          local_40 = (_Rb_tree_node_base *)(p_Var11 + 3);
          if (p_Var7 != local_40) {
            do {
              local_78.offset.offset = *(type *)(p_Var7 + 1);
              p_Var2 = p_Var7[1]._M_parent;
              p_Var8 = p_Var3;
              if (p_Var2 != p_Var3) {
                p_Var8 = (_Base_ptr)((long)p_Var2 - local_78.offset.offset);
                if (p_Var2 < local_78.offset.offset) {
                  p_Var8 = p_Var3;
                }
                if ((_Base_ptr)local_78.offset.offset == p_Var3) {
                  p_Var8 = p_Var3;
                }
              }
              local_78.len.offset = (type)((long)&p_Var8->_M_color + 1);
              if (p_Var1 <= p_Var8) {
                local_78.len.offset = (type)p_Var3;
              }
              if (p_Var8 == p_Var3) {
                local_78.len.offset = (type)p_Var3;
              }
              local_78.target = (RWNode *)p_Var11[1]._M_nxt;
              DefinitionsMap<dg::dda::RWNode>::undefinedIntervals(&local_60,this,&local_78);
              pDVar4 = local_60.
                       super__Vector_base<dg::ADT::DiscreteInterval<dg::Offset>,_std::allocator<dg::ADT::DiscreteInterval<dg::Offset>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish;
              p_Var10 = p_Var7;
              if (local_60.
                  super__Vector_base<dg::ADT::DiscreteInterval<dg::Offset>,_std::allocator<dg::ADT::DiscreteInterval<dg::Offset>_>_>
                  ._M_impl.super__Vector_impl_data._M_start !=
                  local_60.
                  super__Vector_base<dg::ADT::DiscreteInterval<dg::Offset>,_std::allocator<dg::ADT::DiscreteInterval<dg::Offset>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish) {
                pDVar9 = local_60.
                         super__Vector_base<dg::ADT::DiscreteInterval<dg::Offset>,_std::allocator<dg::ADT::DiscreteInterval<dg::Offset>_>_>
                         ._M_impl.super__Vector_impl_data._M_start;
                local_38 = p_Var7;
                do {
                  local_78.offset.offset = (pDVar9->start).offset;
                  p_Var2 = (_Base_ptr)(pDVar9->end).offset;
                  p_Var8 = p_Var3;
                  if (p_Var2 != p_Var3) {
                    p_Var8 = (_Base_ptr)((long)p_Var2 - local_78.offset.offset);
                    if (p_Var2 < local_78.offset.offset) {
                      p_Var8 = p_Var3;
                    }
                    if ((_Base_ptr)local_78.offset.offset == p_Var3) {
                      p_Var8 = p_Var3;
                    }
                  }
                  local_78.len.offset = (type)((long)&p_Var8->_M_color + 1);
                  if (p_Var1 <= p_Var8) {
                    local_78.len.offset = (type)p_Var3;
                  }
                  if (p_Var8 == p_Var3) {
                    local_78.len.offset = (type)p_Var3;
                  }
                  local_78.target = (RWNode *)p_Var11[1]._M_nxt;
                  DefinitionsMap<dg::dda::RWNode>::
                  add<std::set<dg::dda::RWNode*,std::less<dg::dda::RWNode*>,std::allocator<dg::dda::RWNode*>>>
                            (this,&local_78,
                             (set<dg::dda::RWNode_*,_std::less<dg::dda::RWNode_*>,_std::allocator<dg::dda::RWNode_*>_>
                              *)&p_Var7[1]._M_left);
                  pDVar9 = pDVar9 + 1;
                  p_Var10 = local_38;
                } while (pDVar9 != pDVar4);
              }
              if (local_60.
                  super__Vector_base<dg::ADT::DiscreteInterval<dg::Offset>,_std::allocator<dg::ADT::DiscreteInterval<dg::Offset>_>_>
                  ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
                operator_delete(local_60.
                                super__Vector_base<dg::ADT::DiscreteInterval<dg::Offset>,_std::allocator<dg::ADT::DiscreteInterval<dg::Offset>_>_>
                                ._M_impl.super__Vector_impl_data._M_start,
                                (long)local_60.
                                      super__Vector_base<dg::ADT::DiscreteInterval<dg::Offset>,_std::allocator<dg::ADT::DiscreteInterval<dg::Offset>_>_>
                                      ._M_impl.super__Vector_impl_data._M_end_of_storage -
                                (long)local_60.
                                      super__Vector_base<dg::ADT::DiscreteInterval<dg::Offset>,_std::allocator<dg::ADT::DiscreteInterval<dg::Offset>_>_>
                                      ._M_impl.super__Vector_impl_data._M_start);
              }
              p_Var7 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var10);
            } while (p_Var7 != local_40);
          }
        }
      }
      p_Var11 = p_Var11->_M_nxt;
    } while (p_Var11 != (_Hash_node_base *)0x0);
  }
  std::vector<dg::dda::RWNode*,std::allocator<dg::dda::RWNode*>>::
  _M_range_insert<__gnu_cxx::__normal_iterator<dg::dda::RWNode**,std::vector<dg::dda::RWNode*,std::allocator<dg::dda::RWNode*>>>>
            ((vector<dg::dda::RWNode*,std::allocator<dg::dda::RWNode*>> *)&to->unknownWrites,
             (to->unknownWrites).
             super__Vector_base<dg::dda::RWNode_*,_std::allocator<dg::dda::RWNode_*>_>._M_impl.
             super__Vector_impl_data._M_finish,
             (local_48->unknownWrites).
             super__Vector_base<dg::dda::RWNode_*,_std::allocator<dg::dda::RWNode_*>_>._M_impl.
             super__Vector_impl_data._M_start,
             (local_48->unknownWrites).
             super__Vector_base<dg::dda::RWNode_*,_std::allocator<dg::dda::RWNode_*>_>._M_impl.
             super__Vector_impl_data._M_finish);
  return;
}

Assistant:

static void joinDefinitions(Definitions &from, Definitions &to,
                            bool escaping = false) {
    joinDefinitions(from.definitions, to.definitions, escaping);
    to.unknownWrites.insert(to.unknownWrites.end(), from.unknownWrites.begin(),
                            from.unknownWrites.end());
    // we ignore 'kills' and 'unknownReads' as this function is used
    // only when searching for all definitions
}